

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

void __thiscall Jupiter::File::sync(File *this)

{
  FILE *__stream;
  char *in_RSI;
  
  __stream = fopen(in_RSI,"wb");
  if (__stream != (FILE *)0x0) {
    sync(this);
    fclose(__stream);
  }
  return;
}

Assistant:

bool Jupiter::File::sync(const char *file) {
	FILE *filePtr = fopen(file, "wb");
	if (filePtr == nullptr) {
		return false;
	}

	sync(filePtr); // Always returns true.
	fclose(filePtr);
	return true;
}